

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool __thiscall
c4::yml::Parser::_location_from_cont(Parser *this,Tree *tree,size_t node,Location *loc)

{
  char *pcVar1;
  code *pcVar2;
  Location LVar3;
  undefined1 auVar4 [24];
  bool bVar5;
  undefined1 uVar6;
  NodeData *pNVar7;
  size_t node_00;
  csubstr *pcVar8;
  char *pcVar9;
  char *val;
  char msg [40];
  Location local_78;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  char *pcStack_38;
  undefined8 local_30;
  
  if ((node == 0xffffffffffffffff) || (tree->m_cap <= node)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar2 = (code *)swi(3);
      uVar6 = (*pcVar2)();
      return (bool)uVar6;
    }
    local_78.super_LineCol.offset = 0;
    local_78.super_LineCol.line = 0x4b86;
    local_78.super_LineCol.col = 0;
    local_78.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_78.name.len = 0x65;
    (*(code *)PTR_error_impl_002394c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((tree->m_buf[node].m_type.type & (STREAM|MAP)) == NOTYPE) {
    local_78.super_LineCol.col._0_1_ = 'r';
    local_78.super_LineCol.col._1_1_ = 'e';
    local_78.super_LineCol.col._2_1_ = 'e';
    local_78.super_LineCol.col._3_1_ = '.';
    local_78.super_LineCol.col._4_1_ = 'i';
    local_78.super_LineCol.col._5_1_ = 's';
    local_78.super_LineCol.col._6_1_ = '_';
    local_78.super_LineCol.col._7_1_ = 'c';
    local_78.name.str = (char *)0x72656e6961746e6f;
    local_78.super_LineCol.offset._0_1_ = 'c';
    local_78.super_LineCol.offset._1_1_ = 'h';
    local_78.super_LineCol.offset._2_1_ = 'e';
    local_78.super_LineCol.offset._3_1_ = 'c';
    local_78.super_LineCol.offset._4_1_ = 'k';
    local_78.super_LineCol.offset._5_1_ = ' ';
    local_78.super_LineCol.offset._6_1_ = 'f';
    local_78.super_LineCol.offset._7_1_ = 'a';
    local_78.super_LineCol.line._0_1_ = 'i';
    local_78.super_LineCol.line._1_1_ = 'l';
    local_78.super_LineCol.line._2_1_ = 'e';
    local_78.super_LineCol.line._3_1_ = 'd';
    local_78.super_LineCol.line._4_1_ = ':';
    local_78.super_LineCol.line._5_1_ = ' ';
    local_78.super_LineCol.line._6_1_ = '(';
    local_78.super_LineCol.line._7_1_ = 't';
    local_78.name.len = 0x292965646f6e28;
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar2 = (code *)swi(3);
      uVar6 = (*pcVar2)();
      return (bool)uVar6;
    }
    local_50 = 0;
    uStack_48 = 0x7fe5;
    local_40 = 0;
    pcStack_38 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_30 = 0x65;
    auVar4 = ZEXT1224(ZEXT412(0x7fe5) << 0x40);
    LVar3.name.str._0_4_ = 0x1f7eca;
    LVar3.super_LineCol.offset = auVar4._0_8_;
    LVar3.super_LineCol.line = auVar4._8_8_;
    LVar3.super_LineCol.col = auVar4._16_8_;
    LVar3.name.str._4_4_ = 0;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_78,0x28,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
  if ((node == 0xffffffffffffffff) || (tree->m_cap <= node)) {
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar2 = (code *)swi(3);
      uVar6 = (*pcVar2)();
      return (bool)uVar6;
    }
    local_78.super_LineCol.offset = 0;
    local_78.super_LineCol.line = 0x4b86;
    local_78.super_LineCol.col = 0;
    local_78.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_78.name.len = 0x65;
    (*(code *)PTR_error_impl_002394c8)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  pNVar7 = tree->m_buf;
  if ((~(int)pNVar7[node].m_type.type & 0x28U) == 0) {
    val = (this->m_buf).str;
  }
  else {
    if ((node == 0xffffffffffffffff) || (tree->m_cap <= node)) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
        pcVar2 = (code *)swi(3);
        uVar6 = (*pcVar2)();
        return (bool)uVar6;
      }
      local_78.super_LineCol.offset = 0;
      local_78.super_LineCol.line = 0x4b86;
      local_78.super_LineCol.col = 0;
      local_78.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_78.name.len = 0x65;
      (*(code *)PTR_error_impl_002394c8)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
      pNVar7 = tree->m_buf;
    }
    val = pNVar7[node].m_val.scalar.str;
    bVar5 = Tree::has_children(tree,node);
    if (bVar5) {
      node_00 = Tree::first_child(tree,node);
      if ((node_00 == 0xffffffffffffffff) || (tree->m_cap <= node_00)) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
          pcVar2 = (code *)swi(3);
          uVar6 = (*pcVar2)();
          return (bool)uVar6;
        }
        local_78.super_LineCol.offset = 0;
        local_78.super_LineCol.line = 0x4b86;
        local_78.super_LineCol.col = 0;
        local_78.name.str =
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_78.name.len = 0x65;
        (*(code *)PTR_error_impl_002394c8)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((tree->m_buf[node_00].m_type.type & KEY) != NOTYPE) {
        pcVar8 = Tree::key(tree,node_00);
        pcVar1 = pcVar8->str;
        pcVar9 = val;
        if (pcVar1 < val) {
          pcVar9 = pcVar1;
        }
        if (pcVar1 != (char *)0x0) {
          val = pcVar9;
        }
      }
    }
  }
  val_location(&local_78,this,val);
  (loc->name).len = local_78.name.len;
  (loc->super_LineCol).col = local_78.super_LineCol.col;
  (loc->name).str = local_78.name.str;
  (loc->super_LineCol).offset = local_78.super_LineCol.offset;
  (loc->super_LineCol).line = local_78.super_LineCol.line;
  return true;
}

Assistant:

bool Parser::_location_from_cont(Tree const& tree, size_t node, Location *C4_RESTRICT loc) const
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, tree.is_container(node));
    if(!tree.is_stream(node))
    {
        const char *node_start = tree._p(node)->m_val.scalar.str;  // this was stored in the container
        if(tree.has_children(node))
        {
            size_t child = tree.first_child(node);
            if(tree.has_key(child))
            {
                // when a map starts, the container was set after the key
                csubstr k = tree.key(child);
                if(k.str && node_start > k.str)
                    node_start = k.str;
            }
        }
        *loc = val_location(node_start);
        return true;
    }
    else // it's a stream
    {
        *loc = val_location(m_buf.str); // just return the front of the buffer
    }
    return true;
}